

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.h
# Opt level: O0

string * rest_rpc::rpc_service::msgpack_codec::
         pack_args_str<rest_rpc::result_code,std::__cxx11::string_const&,std::__cxx11::string_const&,void>
                   (result_code arg,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  char *pcVar1;
  size_t sVar2;
  short in_SI;
  string *in_RDI;
  buffer_type buffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  sbuffer *this;
  sbuffer *in_stack_ffffffffffffff60;
  int *in_stack_ffffffffffffff68;
  sbuffer *in_stack_ffffffffffffff70;
  allocator *paVar3;
  allocator local_65 [17];
  int local_54;
  sbuffer local_38;
  short local_a;
  
  local_a = in_SI;
  msgpack::v1::sbuffer::sbuffer(in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
  local_54 = (int)local_a;
  std::forward_as_tuple<int,std::__cxx11::string_const&,std::__cxx11::string_const&>
            (in_stack_ffffffffffffff68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  msgpack::v1::
  pack<msgpack::v1::sbuffer,std::tuple<int&&,std::__cxx11::string_const&,std::__cxx11::string_const&>>
            (in_stack_ffffffffffffff60,
             (tuple<int_&&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)in_stack_ffffffffffffff58);
  this = &local_38;
  pcVar1 = msgpack::v1::sbuffer::data(this);
  sVar2 = msgpack::v1::sbuffer::size(this);
  paVar3 = local_65;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,pcVar1,sVar2,paVar3);
  std::allocator<char>::~allocator((allocator<char> *)local_65);
  msgpack::v1::sbuffer::~sbuffer((sbuffer *)0x20d5eb);
  return in_RDI;
}

Assistant:

static std::string pack_args_str(Arg arg, Args &&...args) {
    buffer_type buffer(init_size);
    msgpack::pack(buffer,
                  std::forward_as_tuple((int)arg, std::forward<Args>(args)...));
    return std::string(buffer.data(), buffer.size());
  }